

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O1

int SUNNonlinSolFree(SUNNonlinearSolver NLS)

{
  _func_int_SUNNonlinearSolver *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  if ((NLS != (SUNNonlinearSolver)0x0) && (NLS->ops != (_generic_SUNNonlinearSolver_Ops *)0x0)) {
    UNRECOVERED_JUMPTABLE = NLS->ops->free;
    if (UNRECOVERED_JUMPTABLE != (_func_int_SUNNonlinearSolver *)0x0) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(NLS);
      return iVar1;
    }
    if (NLS->content != (void *)0x0) {
      free(NLS->content);
      NLS->content = (void *)0x0;
    }
    if (NLS->ops != (_generic_SUNNonlinearSolver_Ops *)0x0) {
      free(NLS->ops);
      NLS->ops = (_generic_SUNNonlinearSolver_Ops *)0x0;
    }
    free(NLS);
  }
  return 0;
}

Assistant:

int SUNNonlinSolFree(SUNNonlinearSolver NLS)
{
  if (NLS == NULL) return(SUN_NLS_SUCCESS);
  if (NLS->ops == NULL) return(SUN_NLS_SUCCESS);

  if (NLS->ops->free) {
    return(NLS->ops->free(NLS));
  } else {
    /* free the content structure */
    if (NLS->content) {
      free(NLS->content);
      NLS->content = NULL;
    }
    /* free the ops structure */
    if (NLS->ops) {
      free(NLS->ops);
      NLS->ops = NULL;
    }
    /* free the nonlinear solver */
    free(NLS);
    return(SUN_NLS_SUCCESS);
  }
}